

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

TPZAutoPointer<TPZStructMatrix>
TPZAutoPointerDynamicCast<TPZStructMatrix,TPZSavable>(TPZAutoPointer<TPZSavable> *in)

{
  atomic_int *paVar1;
  TPZReference *this;
  TPZReference *pTVar2;
  long lVar3;
  long *in_RSI;
  
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer((TPZAutoPointer<TPZStructMatrix> *)in);
  if (*(long *)*in_RSI != 0) {
    lVar3 = __dynamic_cast(*(long *)*in_RSI,&TPZSavable::typeinfo,&TPZStructMatrix::typeinfo,
                           0xffffffffffffffff);
    if (lVar3 != 0) {
      this = (TPZReference *)in->fRef;
      if (this != (TPZReference *)0x0) {
        TPZAutoPointer<TPZStructMatrix>::TPZReference::~TPZReference(this);
      }
      operator_delete(this,0x10);
      pTVar2 = (TPZReference *)*in_RSI;
      in->fRef = pTVar2;
      LOCK();
      paVar1 = &pTVar2->fCounter;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
    }
  }
  return (TPZAutoPointer<TPZStructMatrix>)(TPZReference *)in;
}

Assistant:

TPZAutoPointer<R> TPZAutoPointerDynamicCast(TPZAutoPointer<T> in) {
    TPZAutoPointer<R> rv;
    if (R* p; (p = dynamic_cast<R*> (in.fRef->fPointer)) ) {
        delete rv.fRef;
        rv.fRef = (typename TPZAutoPointer<R>::TPZReference *) in.fRef;
        rv.fRef->Increment();
    }
    return rv;
}